

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O0

void __thiscall Omega_h::Comm::bcast<int>(Comm *this,int *x,int root_rank)

{
  int root_rank_local;
  int *x_local;
  Comm *this_local;
  
  return;
}

Assistant:

void Comm::bcast(T& x, int root_rank) const {
#ifdef OMEGA_H_USE_MPI
  CALL(MPI_Bcast(&x, 1, MpiTraits<T>::datatype(), root_rank, impl_));
#else
  (void)x;
  (void)root_rank;
#endif
}